

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void google::protobuf::compiler::java::anon_unknown_0::MaybeRestartJavaMethod
               (Printer *printer,int *bytecode_estimate,int *method_num,char *chain_statement,
               char *method_decl)

{
  int iVar1;
  AlphaNum *a;
  AlphaNum *a_00;
  string local_80;
  AlphaNum local_60;
  
  if (0x8000 < *bytecode_estimate) {
    iVar1 = *method_num;
    *method_num = iVar1 + 1;
    strings::AlphaNum::AlphaNum(&local_60,iVar1 + 1);
    StrCat_abi_cxx11_(&local_80,(protobuf *)&local_60,a);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,chain_statement,(char (*) [11])"method_num",&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"}\n");
    strings::AlphaNum::AlphaNum(&local_60,*method_num);
    StrCat_abi_cxx11_(&local_80,(protobuf *)&local_60,a_00);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,method_decl,(char (*) [11])"method_num",&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    io::Printer::Indent(printer);
    *bytecode_estimate = 0;
  }
  return;
}

Assistant:

void MaybeRestartJavaMethod(io::Printer* printer, int* bytecode_estimate,
                            int* method_num, const char* chain_statement,
                            const char* method_decl) {
  // The goal here is to stay under 64K bytes of jvm bytecode/method,
  // since otherwise we hit a hardcoded limit in the jvm and javac will
  // then fail with the error "code too large". This limit lets our
  // estimates be off by a factor of two and still we're okay.
  static const int bytesPerMethod = kMaxStaticSize;

  if ((*bytecode_estimate) > bytesPerMethod) {
    ++(*method_num);
    printer->Print(chain_statement, "method_num", StrCat(*method_num));
    printer->Outdent();
    printer->Print("}\n");
    printer->Print(method_decl, "method_num", StrCat(*method_num));
    printer->Indent();
    *bytecode_estimate = 0;
  }
}